

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

void __thiscall
TIFFImageHandler::SamplePlanarSeparateToContig
          (TIFFImageHandler *this,uchar *inBuffer,uchar *inSamplebuffer,tsize_t inSamplebuffersize)

{
  long lVar1;
  long lVar2;
  T2P *pTVar3;
  long lVar4;
  uchar *puVar5;
  ulong uVar6;
  
  pTVar3 = this->mT2p;
  lVar1 = inSamplebuffersize / (long)(ulong)pTVar3->tiff_samplesperpixel;
  lVar2 = 0;
  lVar4 = 0;
  if (0 < lVar1) {
    lVar4 = lVar1;
  }
  for (; lVar2 != lVar4; lVar2 = lVar2 + 1) {
    puVar5 = inSamplebuffer;
    for (uVar6 = 0; uVar6 < pTVar3->tiff_samplesperpixel; uVar6 = uVar6 + 1) {
      inBuffer[uVar6 + (ulong)pTVar3->tiff_samplesperpixel * lVar2] = *puVar5;
      pTVar3 = this->mT2p;
      puVar5 = puVar5 + lVar1;
    }
    inSamplebuffer = inSamplebuffer + 1;
  }
  return;
}

Assistant:

void TIFFImageHandler::SamplePlanarSeparateToContig(unsigned char* inBuffer, 
													unsigned char* inSamplebuffer, 
													tsize_t inSamplebuffersize)
{
	tsize_t stride=0;
	tsize_t i=0;
	tsize_t j=0;
	
	stride=inSamplebuffersize/mT2p->tiff_samplesperpixel;
	for(i=0;i<stride;i++){
		for(j=0;j<mT2p->tiff_samplesperpixel;j++){
			inBuffer[i*mT2p->tiff_samplesperpixel + j] = inSamplebuffer[i + j*stride];
		}
	}
}